

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O1

timestamp_t duckdb::Timestamp::FromDatetime(date_t date,dtime_t time)

{
  bool bVar1;
  ConversionException *this;
  timestamp_t result;
  timestamp_t local_48;
  string local_40;
  
  bVar1 = TryFromDatetime(date,time,&local_48);
  if (bVar1) {
    return (timestamp_t)local_48.value;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Date and time not in timestamp range","");
  ConversionException::ConversionException(this,&local_40);
  __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

timestamp_t Timestamp::FromDatetime(date_t date, dtime_t time) {
	timestamp_t result;
	if (!TryFromDatetime(date, time, result)) {
		throw ConversionException("Date and time not in timestamp range");
	}
	return result;
}